

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O3

void get_msurf_descriptor_gauss_s1_separable_test(integral_image *iimage,interest_point *ipoint)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int s;
  int col;
  int iVar8;
  int row;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float __x;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 extraout_var [60];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  float fVar37;
  undefined1 in_register_00001404 [12];
  int local_d8;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  float local_68;
  float local_58;
  float fVar29;
  
  auVar12._8_4_ = 0x3effffff;
  auVar12._0_8_ = 0x3effffff3effffff;
  auVar12._12_4_ = 0x3effffff;
  auVar10._8_4_ = 0x80000000;
  auVar10._0_8_ = 0x8000000080000000;
  auVar10._12_4_ = 0x80000000;
  fVar17 = ipoint->scale;
  auVar36 = ZEXT464((uint)fVar17);
  iVar8 = 0;
  lVar6 = 0;
  auVar35 = ZEXT416((uint)fVar17);
  auVar9 = vpternlogd_avx512vl(auVar12,auVar35,auVar10,0xf8);
  auVar9 = ZEXT416((uint)(fVar17 + auVar9._0_4_));
  auVar9 = vroundss_avx(auVar9,auVar9,0xb);
  s = (int)(auVar9._0_4_ + auVar9._0_4_);
  fVar37 = -0.08 / (fVar17 * fVar17);
  auVar9 = vpternlogd_avx512vl(auVar12,ZEXT416((uint)ipoint->x),auVar10,0xf8);
  auVar10 = vpternlogd_avx512vl(auVar12,ZEXT416((uint)ipoint->y),auVar10,0xf8);
  auVar32._0_8_ = (double)fVar17;
  auVar32._8_8_ = 0;
  auVar9 = ZEXT416((uint)(ipoint->x + auVar9._0_4_));
  auVar9 = vroundss_avx(auVar9,auVar9,0xb);
  auVar13._0_8_ = (double)auVar9._0_4_;
  auVar13._8_8_ = auVar9._8_8_;
  auVar9 = vfmadd231sd_fma(auVar13,auVar32,ZEXT816(0x3fe0000000000000));
  fVar29 = (float)auVar9._0_8_;
  auVar30 = ZEXT1664(CONCAT124(auVar9._4_12_,fVar29));
  fVar17 = -2.5;
  auVar9 = ZEXT416((uint)(ipoint->y + auVar10._0_4_));
  auVar9 = vroundss_avx(auVar9,auVar9,0xb);
  auVar11._0_8_ = (double)auVar9._0_4_;
  auVar11._8_8_ = auVar9._8_8_;
  auVar9 = vfmadd231sd_fma(auVar11,auVar32,ZEXT816(0x3fe0000000000000));
  auVar33 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
  auVar34 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
  __x = 0.0;
  iVar3 = -8;
  do {
    fVar17 = fVar17 + 1.0;
    auVar31._0_4_ = (float)iVar3;
    auVar31._4_12_ = in_register_00001404;
    lVar6 = (long)(int)lVar6;
    local_d8 = -3;
    auVar10 = vfmadd213ss_fma(auVar31,auVar36._0_16_,auVar30._0_16_);
    auVar11 = vpternlogd_avx512vl(auVar33._0_16_,auVar10,auVar34._0_16_,0xf8);
    auVar10 = ZEXT416((uint)(auVar10._0_4_ + auVar11._0_4_));
    auVar10 = vroundss_avx(auVar10,auVar10,0xb);
    auVar27._0_4_ = (int)auVar10._0_4_;
    auVar27._4_4_ = (int)auVar10._4_4_;
    auVar27._8_4_ = (int)auVar10._8_4_;
    auVar27._12_4_ = (int)auVar10._12_4_;
    auVar10 = vcvtdq2ps_avx(auVar27);
    fVar26 = -2.5;
    iVar4 = -8;
    do {
      auVar18._0_4_ = (float)iVar4;
      auVar18._4_12_ = in_register_00001404;
      auVar11 = vfmadd213ss_fma(auVar18,auVar36._0_16_,ZEXT416((uint)(float)auVar9._0_8_));
      fVar26 = fVar26 + 1.0;
      iVar5 = iVar4 + -4;
      auVar12 = vpternlogd_avx512vl(auVar33._0_16_,auVar11,auVar34._0_16_,0xf8);
      auVar11 = ZEXT416((uint)(auVar11._0_4_ + auVar12._0_4_));
      auVar11 = vroundss_avx(auVar11,auVar11,0xb);
      auVar19._0_4_ = (int)auVar11._0_4_;
      auVar19._4_4_ = (int)auVar11._4_4_;
      auVar19._8_4_ = (int)auVar11._8_4_;
      auVar19._12_4_ = (int)auVar11._12_4_;
      auVar11 = vcvtdq2ps_avx(auVar19);
      _local_b8 = ZEXT816(0) << 0x20;
      do {
        auVar20._0_4_ = (float)iVar5;
        auVar20._4_12_ = in_register_00001404;
        auVar12 = vfmadd213ss_fma(auVar20,auVar36._0_16_,ZEXT416((uint)(float)auVar9._0_8_));
        iVar7 = -0xc;
        auVar13 = vpternlogd_avx512vl(auVar33._0_16_,auVar12,auVar34._0_16_,0xf8);
        local_68 = auVar11._0_4_;
        auVar12 = ZEXT416((uint)(auVar12._0_4_ + auVar13._0_4_));
        auVar12 = vroundss_avx(auVar12,auVar12,0xb);
        row = (int)auVar12._0_4_;
        auVar21._0_4_ = (int)auVar12._0_4_;
        auVar21._4_4_ = (int)auVar12._4_4_;
        auVar21._8_4_ = (int)auVar12._8_4_;
        auVar21._12_4_ = (int)auVar12._12_4_;
        auVar12 = vcvtdq2ps_avx(auVar21);
        local_68 = local_68 - auVar12._0_4_;
        do {
          auVar22._0_4_ = (float)(iVar8 + iVar7);
          auVar22._4_12_ = in_register_00001404;
          auVar12 = vfmadd213ss_fma(auVar22,auVar36._0_16_,ZEXT416((uint)fVar29));
          auVar13 = vpternlogd_avx512vl(auVar33._0_16_,auVar12,auVar34._0_16_,0xf8);
          local_58 = auVar10._0_4_;
          auVar12 = ZEXT416((uint)(auVar12._0_4_ + auVar13._0_4_));
          auVar12 = vroundss_avx(auVar12,auVar12,0xb);
          col = (int)auVar12._0_4_;
          auVar23._0_4_ = (int)auVar12._0_4_;
          auVar23._4_4_ = (int)auVar12._4_4_;
          auVar23._8_4_ = (int)auVar12._8_4_;
          auVar23._12_4_ = (int)auVar12._12_4_;
          auVar12 = vcvtdq2ps_avx(auVar23);
          local_58 = local_58 - auVar12._0_4_;
          fVar14 = expf(fVar37 * local_58 * local_58);
          fVar15 = expf(fVar37 * local_68 * local_68);
          fVar15 = fVar15 * fVar14;
          fVar14 = haarX_improved(iimage,row,col,s);
          auVar30._0_4_ = haarY_improved(iimage,row,col,s);
          auVar30._4_60_ = extraout_var;
          auVar12 = vinsertps_avx(auVar30._0_16_,ZEXT416((uint)fVar14),0x10);
          auVar34 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar33 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
          auVar36 = ZEXT1664(auVar35);
          iVar7 = iVar7 + 1;
          auVar24._0_4_ = fVar15 * auVar12._0_4_;
          auVar24._4_4_ = fVar15 * auVar12._4_4_;
          auVar24._8_4_ = fVar15 * auVar12._8_4_;
          auVar24._12_4_ = fVar15 * auVar12._12_4_;
          auVar2._8_4_ = 0x7fffffff;
          auVar2._0_8_ = 0x7fffffff7fffffff;
          auVar2._12_4_ = 0x7fffffff;
          auVar12 = vandps_avx512vl(auVar24,auVar2);
          auVar12 = vmovlhps_avx(auVar24,auVar12);
          local_b8._4_4_ = (undefined4)((ulong)local_b8 >> 0x20);
          uStack_b0._4_4_ = (float)((ulong)uStack_b0 >> 0x20);
          local_b8._0_4_ = (float)local_b8._0_4_ + auVar12._0_4_;
          local_b8._4_4_ = (float)local_b8._4_4_ + auVar12._4_4_;
          fVar15 = (float)uStack_b0 + auVar12._8_4_;
          fVar14 = uStack_b0._4_4_ + auVar12._12_4_;
          uStack_b0._0_4_ = fVar15;
          uStack_b0._4_4_ = fVar14;
        } while (iVar7 != -3);
        iVar5 = iVar5 + 1;
      } while (iVar5 != local_d8);
      fVar16 = expf((fVar26 * fVar26 + fVar17 * fVar17) * -0.22222222);
      auVar25._0_4_ = fVar16 * (float)local_b8._0_4_;
      auVar25._4_4_ = fVar16 * (float)local_b8._4_4_;
      auVar25._8_4_ = fVar16 * fVar15;
      auVar25._12_4_ = fVar16 * fVar14;
      auVar34 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
      auVar33 = ZEXT1664(CONCAT412(0x3effffff,CONCAT48(0x3effffff,0x3effffff3effffff)));
      auVar36 = ZEXT1664(auVar35);
      local_d8 = local_d8 + 5;
      auVar28._0_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar28._4_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar28._8_4_ = auVar25._8_4_ * auVar25._8_4_;
      auVar28._12_4_ = auVar25._12_4_ * auVar25._12_4_;
      auVar12 = vshufpd_avx(auVar25,auVar25,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar6) = auVar25;
      lVar6 = lVar6 + 4;
      auVar11 = vmovshdup_avx(auVar28);
      auVar11 = vfmadd231ss_fma(auVar11,auVar25,auVar25);
      auVar12 = vfmadd213ss_fma(auVar12,auVar12,auVar11);
      auVar11 = vshufps_avx(auVar25,auVar25,0xff);
      auVar11 = vfmadd213ss_fma(auVar11,auVar11,auVar12);
      __x = __x + auVar11._0_4_;
      bVar1 = iVar4 < 3;
      iVar4 = iVar4 + 5;
    } while (bVar1);
    auVar30 = ZEXT464((uint)fVar29);
    iVar8 = iVar8 + 5;
    bVar1 = iVar3 < 3;
    iVar3 = iVar3 + 5;
  } while (bVar1);
  if (__x < 0.0) {
    fVar17 = sqrtf(__x);
  }
  else {
    auVar9 = vsqrtss_avx(ZEXT416((uint)__x),ZEXT416((uint)__x));
    fVar17 = auVar9._0_4_;
  }
  lVar6 = 0;
  auVar30 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar17)));
  do {
    auVar33 = vmulps_avx512f(auVar30,*(undefined1 (*) [64])(ipoint->descriptor + lVar6));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar6) = auVar33;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_gauss_s1_separable_test(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_descriptor_inlined
    ideas:
        - test if gauss_s1 can be separated in x and y direction gauss_s1 = gauss_s1_x * gauss_s1_y
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale_mul_2 = (int) 2 * roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;
    
    // subregion centers for the 4x4 gaussian weighting
    float cx = -2.5f;
    float cy;

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        cx += 1.0f;
        float cx_squared = cx*cx;
        
        cy = -2.5f;

        for (int j=-8; j<8; j+=5) {

            cy += 1.0f;
            float cy_squared = cy*cy;
            
            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int xs = (int) roundf(ipoint_x + i * scale);
            int ys = (int) roundf(ipoint_y + j * scale);

            for (int l = j-4; l < j + 5; ++l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                float ys_sub_sample_y = (float) ys-sample_y;
                float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                for (int k = i-4; k < i + 5; ++k) {

                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    float xs_sub_sample_x = (float) xs-sample_x;
                    float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    // Get the separable gaussian kernels in x and y direction
                    float gauss_s1_x = expf(g1_factor * (xs_sub_sample_x_squared));
                    float gauss_s1_y = expf(g1_factor * (ys_sub_sample_y_squared));

                    // Computing gauss_s1 2d kernel weight with separable gaussian in x and y direction
                    float gauss_s1 = gauss_s1_x * gauss_s1_y;
                    
                    float rx = haarX_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    float ry = haarY_improved(iimage, sample_y, sample_x, int_scale_mul_2);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Computing gauss_s2 2d kernel weight
            float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}